

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

int fmt::v8::detail::count_digits<4,fmt::v8::detail::fallback_uintptr>(fallback_uintptr n)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  fallback_uintptr n_local;
  
  n_local = n;
  uVar2 = 8;
  do {
    uVar1 = (ulong)(uVar2 - 1);
    if (n_local.value[uVar1] != '\0') goto LAB_0010e55d;
    uVar2 = uVar2 - 1;
  } while (1 < uVar2);
  uVar1 = 0;
LAB_0010e55d:
  uVar3 = n_local.value[uVar1] | 1;
  uVar2 = 0x1f;
  if (uVar3 != 0) {
    for (; uVar3 >> uVar2 == 0; uVar2 = uVar2 - 1) {
    }
  }
  return ((int)uVar1 * 2 - ((uVar2 ^ 0x1c) >> 2)) + 8;
}

Assistant:

FMT_FUNC int count_digits<4>(detail::fallback_uintptr n) {
  // fallback_uintptr is always stored in little endian.
  int i = static_cast<int>(sizeof(void*)) - 1;
  while (i > 0 && n.value[i] == 0) --i;
  auto char_digits = std::numeric_limits<unsigned char>::digits / 4;
  return i >= 0 ? i * char_digits + count_digits<4, unsigned>(n.value[i]) : 1;
}